

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int divbwt(uchar *T,uchar *U,int *A,int n,uchar *num_indexes,int *indexes,int openMP)

{
  void *__ptr;
  void *__ptr_00;
  int in_ECX;
  uchar *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int *in_R8;
  int *in_R9;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int *in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int i;
  int pidx;
  int m;
  int *bucket_B;
  int *bucket_A;
  int *B;
  int local_5c;
  int local_58;
  undefined4 in_stack_ffffffffffffffd8;
  uchar *T_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (((in_RDI == (int *)0x0) || (in_RSI == (int *)0x0)) || (in_ECX < 0)) {
    local_58 = -1;
  }
  else if (in_ECX < 2) {
    local_58 = in_ECX;
    if (in_ECX == 1) {
      *(char *)in_RSI = (char)*in_RDI;
    }
  }
  else {
    T_00 = in_RDX;
    if (in_RDX == (uchar *)0x0) {
      in_RDX = (uchar *)malloc((long)(in_ECX + 1) << 2);
    }
    __ptr = malloc(0x400);
    __ptr_00 = malloc(0x40000);
    if (((in_RDX == (uchar *)0x0) || (__ptr == (void *)0x0)) || (__ptr_00 == (void *)0x0)) {
      local_58 = -2;
    }
    else {
      sort_typeBstar((uchar *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                     (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                     in_RSI,(int)((ulong)T_00 >> 0x20),(int)T_00);
      if ((in_R8 == (int *)0x0) || (in_R9 == (int *)0x0)) {
        local_58 = construct_BWT(T_00,(int *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_R8,in_R9,
                                 (int)((ulong)in_RDX >> 0x20),(int)in_RDX);
      }
      else {
        local_58 = construct_BWT_indexes
                             (_pidx,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                              unaff_retaddr_00,unaff_retaddr,(uchar *)bucket_A,B);
      }
      *(undefined1 *)in_RSI = *(undefined1 *)((long)in_RDI + (long)(in_ECX + -1));
      for (local_5c = 0; local_5c < local_58; local_5c = local_5c + 1) {
        *(char *)((long)in_RSI + (long)(local_5c + 1)) =
             (char)*(undefined4 *)(in_RDX + (long)local_5c * 4);
      }
      while (local_5c = local_5c + 1, local_5c < in_ECX) {
        *(char *)((long)in_RSI + (long)local_5c) =
             (char)*(undefined4 *)(in_RDX + (long)local_5c * 4);
      }
      local_58 = local_58 + 1;
    }
    free(__ptr_00);
    free(__ptr);
    if (T_00 == (uchar *)0x0) {
      free(in_RDX);
    }
  }
  return local_58;
}

Assistant:

int
divbwt(const unsigned char *T, unsigned char *U, int *A, int n, unsigned char * num_indexes, int * indexes, int openMP) {
  int *B;
  int *bucket_A, *bucket_B;
  int m, pidx, i;

  /* Check arguments. */
  if((T == NULL) || (U == NULL) || (n < 0)) { return -1; }
  else if(n <= 1) { if(n == 1) { U[0] = T[0]; } return n; }

  if((B = A) == NULL) { B = (int *)malloc((size_t)(n + 1) * sizeof(int)); }
  bucket_A = (int *)malloc(BUCKET_A_SIZE * sizeof(int));
  bucket_B = (int *)malloc(BUCKET_B_SIZE * sizeof(int));

  /* Burrows-Wheeler Transform. */
  if((B != NULL) && (bucket_A != NULL) && (bucket_B != NULL)) {
    m = sort_typeBstar(T, B, bucket_A, bucket_B, n, openMP);

    if (num_indexes == NULL || indexes == NULL) {
        pidx = construct_BWT(T, B, bucket_A, bucket_B, n, m);
    } else {
        pidx = construct_BWT_indexes(T, B, bucket_A, bucket_B, n, m, num_indexes, indexes);
    }

    /* Copy to output string. */
    U[0] = T[n - 1];
    for(i = 0; i < pidx; ++i) { U[i + 1] = (unsigned char)B[i]; }
    for(i += 1; i < n; ++i) { U[i] = (unsigned char)B[i]; }
    pidx += 1;
  } else {
    pidx = -2;
  }

  free(bucket_B);
  free(bucket_A);
  if(A == NULL) { free(B); }

  return pidx;
}